

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O2

void jpeg_fdct_3x6(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  memset(data,0,0x100);
  uVar3 = (ulong)start_col;
  for (lVar13 = 0; lVar13 != 0x30; lVar13 = lVar13 + 8) {
    lVar11 = *(long *)((long)sample_data + lVar13);
    bVar1 = *(byte *)(lVar11 + uVar3);
    bVar2 = *(byte *)(lVar11 + 2 + uVar3);
    iVar9 = (uint)bVar2 + (uint)bVar1;
    uVar4 = (uint)*(byte *)(lVar11 + 1 + uVar3);
    data[lVar13] = (iVar9 + uVar4) * 8 + -0xc00;
    data[lVar13 + 2] = (int)(iVar9 * 0x16a1 + uVar4 * -0x2d42 + 0x200) >> 10;
    data[lVar13 + 1] = (int)(((uint)bVar1 - (uint)bVar2) * 0x2731 + 0x200) >> 10;
  }
  for (lVar13 = 0; (int)lVar13 != 3; lVar13 = lVar13 + 1) {
    lVar12 = (long)(data[lVar13 + 0x28] + data[lVar13]);
    lVar10 = (long)(data[lVar13 + 0x20] + data[lVar13 + 8]);
    lVar7 = (long)(data[lVar13 + 0x18] + data[lVar13 + 0x10]);
    lVar11 = lVar7 + lVar12;
    lVar8 = (long)(data[lVar13] - data[lVar13 + 0x28]);
    lVar5 = (long)(data[lVar13 + 8] - data[lVar13 + 0x20]);
    lVar6 = (long)(data[lVar13 + 0x10] - data[lVar13 + 0x18]);
    data[lVar13] = (DCTELEM)((lVar11 + lVar10) * 0x38e4 + 0x4000U >> 0xf);
    data[lVar13 + 0x10] = (DCTELEM)((lVar12 - lVar7) * 0x45ad + 0x4000U >> 0xf);
    data[lVar13 + 0x20] = (DCTELEM)((lVar11 + lVar10 * -2) * 0x283a + 0x4000U >> 0xf);
    lVar11 = (lVar6 + lVar8) * 0x14d3;
    data[lVar13 + 8] = (DCTELEM)((lVar5 + lVar8) * 0x38e4 + lVar11 + 0x4000U >> 0xf);
    data[lVar13 + 0x18] = (DCTELEM)(((lVar8 - lVar5) - lVar6) * 0x38e4 + 0x4000U >> 0xf);
    data[lVar13 + 0x28] = (DCTELEM)((lVar6 - lVar5) * 0x38e4 + lVar11 + 0x4000U >> 0xf);
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_3x6 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2;
  INT32 tmp10, tmp11, tmp12;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* We scale the results further by 2 as part of output adaption */
  /* scaling for different DCT size. */
  /* 3-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/6). */

  dataptr = data;
  for (ctr = 0; ctr < 6; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[2]);
    tmp1 = GETJSAMPLE(elemptr[1]);

    tmp2 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[2]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp0 + tmp1 - 3 * CENTERJSAMPLE) << (PASS1_BITS+1));
    dataptr[2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 - tmp1 - tmp1, FIX(0.707106781)), /* c2 */
	      CONST_BITS-PASS1_BITS-1);

    /* Odd part */

    dataptr[1] = (DCTELEM)
      DESCALE(MULTIPLY(tmp2, FIX(1.224744871)),               /* c1 */
	      CONST_BITS-PASS1_BITS-1);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by (8/6)*(8/3) = 32/9, which we partially
   * fold into the constant multipliers (other part was done in pass 1):
   * 6-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/12) * 16/9.
   */

  dataptr = data;
  for (ctr = 0; ctr < 3; ctr++) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*5];
    tmp11 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*3];

    tmp10 = tmp0 + tmp2;
    tmp12 = tmp0 - tmp2;

    tmp0 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*5];
    tmp1 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*3];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp11, FIX(1.777777778)),         /* 16/9 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp12, FIX(2.177324216)),                 /* c2 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp11 - tmp11, FIX(1.257078722)), /* c4 */
	      CONST_BITS+PASS1_BITS);

    /* Odd part */

    tmp10 = MULTIPLY(tmp0 + tmp2, FIX(0.650711829));             /* c5 */

    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp0 + tmp1, FIX(1.777777778)),   /* 16/9 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 - tmp1 - tmp2, FIX(1.777777778)),    /* 16/9 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*5] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp2 - tmp1, FIX(1.777777778)),   /* 16/9 */
	      CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}